

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall
ON_MeshComponentRef::GetBBox(ON_MeshComponentRef *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  int iVar1;
  ON_Mesh *this_00;
  ON_MeshTopologyEdge *pOVar2;
  ON_MeshTopologyVertex *pOVar3;
  uint *puVar4;
  ON_MeshFace *pOVar5;
  uint uVar6;
  bool bVar7;
  ON_MeshNgon *pOVar8;
  ON_MeshTopology *pOVar9;
  long lVar10;
  bool bVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ON_MeshFace *pOVar16;
  ulong uVar17;
  uint vdex_buffer [2];
  ON_3dPointListRef vertex_list;
  ON_3dPoint v [16];
  
  this_00 = this->m_mesh;
  if (this_00 == (ON_Mesh *)0x0) {
    return false;
  }
  uVar12 = 1;
  switch((this->m_mesh_ci).m_type) {
  case mesh_vertex:
    vdex_buffer[0] = (this->m_mesh_ci).m_index;
    break;
  case meshtop_vertex:
    if ((this->m_mesh_ci).m_index < 0) {
      return false;
    }
    pOVar9 = MeshTopology(this);
    if (pOVar9 == (ON_MeshTopology *)0x0) {
      return false;
    }
    iVar15 = (this->m_mesh_ci).m_index;
    if ((pOVar9->m_topv).m_count <= iVar15) {
      return false;
    }
    pOVar3 = (pOVar9->m_topv).m_a;
    if (pOVar3[iVar15].m_v_count < 1) {
      return false;
    }
    puVar4 = (uint *)pOVar3[iVar15].m_vi;
    if (puVar4 == (uint *)0x0) {
      return false;
    }
    vdex_buffer[0] = *puVar4;
    break;
  case meshtop_edge:
    if ((this->m_mesh_ci).m_index < 0) {
      return false;
    }
    pOVar9 = MeshTopology(this);
    if (pOVar9 == (ON_MeshTopology *)0x0) {
      return false;
    }
    iVar15 = (this->m_mesh_ci).m_index;
    if ((pOVar9->m_tope).m_count <= iVar15) {
      return false;
    }
    pOVar2 = (pOVar9->m_tope).m_a;
    uVar14 = 0;
    for (lVar10 = 0; uVar6 = (uint)uVar14, lVar10 != 2; lVar10 = lVar10 + 1) {
      iVar1 = pOVar2[iVar15].m_topvi[lVar10];
      lVar13 = (long)iVar1;
      uVar17 = uVar14;
      if ((((-1 < lVar13) && (iVar1 < (pOVar9->m_topv).m_count)) &&
          (pOVar3 = (pOVar9->m_topv).m_a, 0 < pOVar3[lVar13].m_v_count)) &&
         ((puVar4 = (uint *)pOVar3[lVar13].m_vi, puVar4 != (uint *)0x0 &&
          (uVar12 = *puVar4, -1 < (int)uVar12)))) {
        uVar17 = (ulong)((uint)uVar14 + 1);
        vdex_buffer[uVar14] = uVar12;
      }
      uVar14 = uVar17;
    }
    goto LAB_005245dd;
  case mesh_face:
    iVar15 = (this->m_mesh_ci).m_index;
    lVar10 = (long)iVar15;
    if (lVar10 < 0) {
      return false;
    }
    if ((this_00->m_F).m_count <= iVar15) {
      return false;
    }
    pOVar5 = (this_00->m_F).m_a;
    pOVar16 = pOVar5 + lVar10;
    uVar12 = (pOVar5[lVar10].vi[2] != pOVar5[lVar10].vi[3]) + 3;
    goto LAB_005246a2;
  case mesh_ngon:
    pOVar8 = ON_Mesh::Ngon(this_00,(this->m_mesh_ci).m_index);
    if (pOVar8 == (ON_MeshNgon *)0x0) {
      return false;
    }
    uVar12 = pOVar8->m_Vcount;
    if (uVar12 == 0) {
      return false;
    }
    pOVar16 = (ON_MeshFace *)pOVar8->m_vi;
    uVar6 = 0;
    if (pOVar16 != (ON_MeshFace *)0x0) goto LAB_005246a2;
LAB_005245dd:
    uVar12 = uVar6;
    if (uVar12 != 0) {
      pOVar16 = (ON_MeshFace *)vdex_buffer;
      goto LAB_005246a2;
    }
  default:
    goto LAB_005247e9;
  }
  if (-1 < (int)vdex_buffer[0]) {
    pOVar16 = (ON_MeshFace *)vdex_buffer;
LAB_005246a2:
    ON_3dPointListRef::ON_3dPointListRef(&vertex_list,this->m_mesh);
    bVar11 = false;
    uVar14 = 0;
    for (uVar17 = 0; iVar15 = (int)uVar14, uVar12 != uVar17; uVar17 = uVar17 + 1) {
      if ((uint)pOVar16->vi[uVar17] < vertex_list.m_point_count) {
        ON_3dPointListRef::GetPoint(&vertex_list,pOVar16->vi[uVar17],&v[uVar14].x);
        bVar7 = ON_3dPoint::IsValid(v + uVar14);
        if ((bVar7) && (uVar14 = (ulong)(iVar15 + 1U), iVar15 + 1U == 0x10)) {
          uVar14 = 0;
          bVar7 = ON_GetPointListBoundingBox
                            (3,false,0x10,3,&v[0].x,boxmin,boxmax,(uint)(bGrowBox & 1));
          bVar11 = (bool)(bVar11 | bVar7);
          if (bVar7) {
            bGrowBox = true;
          }
        }
      }
    }
    if (iVar15 != 0) {
      bVar7 = ON_GetPointListBoundingBox
                        (3,false,iVar15,3,&v[0].x,boxmin,boxmax,(uint)(bGrowBox & 1));
      return (bool)(bVar7 | bVar11);
    }
    return bVar11;
  }
LAB_005247e9:
  return false;
}

Assistant:

bool ON_MeshComponentRef::GetBBox(
       double* boxmin,
       double* boxmax,
       bool bGrowBox
       ) const
{
  const unsigned int* vdex_list = 0;
  unsigned int vdex_count = 0;
  unsigned int vdex_buffer[2];

  if ( 0 == m_mesh )
    return false;

  switch(m_mesh_ci.m_type)
  {
  case ON_COMPONENT_INDEX::mesh_vertex:
    if (m_mesh_ci.m_index >= 0)
      vdex_buffer[vdex_count++] = (unsigned int)m_mesh_ci.m_index;
    break;

  case ON_COMPONENT_INDEX::meshtop_vertex:
    if ( m_mesh_ci.m_index >= 0 )
    {
      const ON_MeshTopology* top = MeshTopology();
      if ( 0 != top && m_mesh_ci.m_index < top->m_topv.Count())
      {
        const ON_MeshTopologyVertex& v = top->m_topv[m_mesh_ci.m_index];
        if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 )
          vdex_buffer[vdex_count++] = (unsigned int)v.m_vi[0];
      }
    }
    break;

  case ON_COMPONENT_INDEX::meshtop_edge:
    if ( m_mesh_ci.m_index >= 0 )
    {
      const ON_MeshTopology* top = MeshTopology();
      if ( 0 != top && m_mesh_ci.m_index < top->m_tope.Count())
      {
        const ON_MeshTopologyEdge& e = top->m_tope[m_mesh_ci.m_index];
        for ( unsigned int j = 0; j < 2; j++ )
        {
          if ( e.m_topvi[j] >= 0 && e.m_topvi[j] < top->m_topv.Count() )
          {
            const ON_MeshTopologyVertex& v = top->m_topv[e.m_topvi[j]];
            if ( v.m_v_count > 0 && 0 != v.m_vi && v.m_vi[0] >= 0 )
            {
              vdex_buffer[vdex_count++] = (unsigned int)v.m_vi[0];
            }
          }
        }
      }
    }
    break;

  case ON_COMPONENT_INDEX::mesh_face:
    if (m_mesh_ci.m_index >= 0 && m_mesh_ci.m_index < m_mesh->m_F.Count())
    {
      vdex_list = (const unsigned int*)(m_mesh->m_F[m_mesh_ci.m_index].vi);
      vdex_count = (vdex_list[2] == vdex_list[3]) ? 3 : 4;
    }
    break;

  case ON_COMPONENT_INDEX::mesh_ngon:
    {
      const ON_MeshNgon* ngon = m_mesh->Ngon(m_mesh_ci.m_index);
      if ( ngon && ngon->m_Vcount > 0 && 0 != ngon->m_vi )
      {
        vdex_list = ngon->m_vi;
        vdex_count = ngon->m_Vcount;
      }
    }
    break;

  default:
    break;
  }

  if ( 0 == vdex_list )
  {
    if ( 0 == vdex_count )
      return 0;
    vdex_list = vdex_buffer;
  }

  bool rc = false;
  const ON_3dPointListRef vertex_list(m_mesh);
  const unsigned int vertex_count = vertex_list.PointCount();
  ON_3dPoint v[16];
  const unsigned int v_capacity = (unsigned int)(sizeof(v)/sizeof(v[0]));
  unsigned int v_count = 0;
  for ( unsigned int i = 0; i < vdex_count; i++ )
  {
    if ( vdex_list[i] < vertex_count )
    {
      vertex_list.GetPoint(vdex_list[i],&v[v_count].x);
      if ( v[v_count].IsValid() )
      {
        v_count++;
        if ( v_capacity == v_count )
        {
          if ( ON_GetPointListBoundingBox( 3, 0, v_count, 3, &v[0].x, boxmin, boxmax, bGrowBox?true:false ) )
          {
            bGrowBox = true;
            rc = true;
          }
          v_count = 0;
        }
      }
    }
  }

  if ( v_count > 0 )
  {
    if ( ON_GetPointListBoundingBox( 3, 0, v_count, 3, &v[0].x, boxmin, boxmax, bGrowBox?true:false ) )
      rc = true;
    v_count = 0;
  }

  return rc;
}